

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclUpsize.c
# Opt level: O0

void Abc_SclFindCriticalNodeWindow_rec
               (SC_Man *p,Abc_Obj_t *pObj,Vec_Int_t *vPath,float fSlack,int fDept)

{
  int iVar1;
  uint Entry;
  Abc_Obj_t *pObj_00;
  float fVar2;
  int local_3c;
  float local_38;
  int i;
  float fSlackFan;
  float fArrMax;
  Abc_Obj_t *pNext;
  int fDept_local;
  float fSlack_local;
  Vec_Int_t *vPath_local;
  Abc_Obj_t *pObj_local;
  SC_Man *p_local;
  
  iVar1 = Abc_ObjIsCi(pObj);
  if ((iVar1 == 0) && (iVar1 = Abc_NodeIsTravIdCurrent(pObj), iVar1 == 0)) {
    Abc_NodeSetTravIdCurrent(pObj);
    iVar1 = Abc_ObjIsNode(pObj);
    if (iVar1 == 0) {
      __assert_fail("Abc_ObjIsNode(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclUpsize.c"
                    ,0x85,
                    "void Abc_SclFindCriticalNodeWindow_rec(SC_Man *, Abc_Obj_t *, Vec_Int_t *, float, int)"
                   );
    }
    if (fDept == 0) {
      i = (int)Abc_SclGetMaxDelayNodeFanins(p,pObj);
    }
    else {
      i = (int)Abc_SclObjGetSlack(p,pObj,p->MaxDelay);
    }
    fVar2 = Abc_MaxFloat((float)i,0.0);
    for (local_3c = 0; iVar1 = Abc_ObjFaninNum(pObj), local_3c < iVar1; local_3c = local_3c + 1) {
      pObj_00 = Abc_ObjFanin(pObj,local_3c);
      iVar1 = Abc_ObjIsCi(pObj_00);
      if ((iVar1 == 0) && (iVar1 = Abc_ObjFaninNum(pObj_00), iVar1 != 0)) {
        iVar1 = Abc_ObjIsNode(pObj_00);
        if (iVar1 == 0) {
          __assert_fail("Abc_ObjIsNode(pNext)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclUpsize.c"
                        ,0x93,
                        "void Abc_SclFindCriticalNodeWindow_rec(SC_Man *, Abc_Obj_t *, Vec_Int_t *, float, int)"
                       );
        }
        if (fDept == 0) {
          local_38 = Abc_SclObjTimeMax(p,pObj_00);
          local_38 = fVar2 - local_38;
        }
        else {
          local_38 = Abc_SclObjGetSlack(p,pObj_00,p->MaxDelay);
          local_38 = local_38 - fVar2;
        }
        local_38 = fSlack - local_38;
        if (0.0 <= local_38) {
          Abc_SclFindCriticalNodeWindow_rec(p,pObj_00,vPath,local_38,fDept);
        }
      }
    }
    iVar1 = Abc_ObjFaninNum(pObj);
    if (0 < iVar1) {
      Entry = Abc_ObjId(pObj);
      Vec_IntPush(vPath,Entry);
    }
  }
  return;
}

Assistant:

void Abc_SclFindCriticalNodeWindow_rec( SC_Man * p, Abc_Obj_t * pObj, Vec_Int_t * vPath, float fSlack, int fDept )
{
    Abc_Obj_t * pNext;
    float fArrMax, fSlackFan;
    int i;
    if ( Abc_ObjIsCi(pObj) )
        return;
    if ( Abc_NodeIsTravIdCurrent( pObj ) )
        return;
    Abc_NodeSetTravIdCurrent( pObj );
    assert( Abc_ObjIsNode(pObj) );
    // compute the max arrival time of the fanins
    if ( fDept )
//        fArrMax = p->pSlack[Abc_ObjId(pObj)];
        fArrMax = Abc_SclObjGetSlack(p, pObj, p->MaxDelay);
    else
        fArrMax = Abc_SclGetMaxDelayNodeFanins( p, pObj );
//    assert( fArrMax >= -1 );
    fArrMax = Abc_MaxFloat( fArrMax, 0 );
    // traverse all fanins whose arrival times are within a window
    Abc_ObjForEachFanin( pObj, pNext, i )
    {
        if ( Abc_ObjIsCi(pNext) || Abc_ObjFaninNum(pNext) == 0 )
            continue;
        assert( Abc_ObjIsNode(pNext) );
        if ( fDept )
//            fSlackFan = fSlack - (p->pSlack[Abc_ObjId(pNext)] - fArrMax);
            fSlackFan = fSlack - (Abc_SclObjGetSlack(p, pNext, p->MaxDelay) - fArrMax);
        else
            fSlackFan = fSlack - (fArrMax - Abc_SclObjTimeMax(p, pNext));
        if ( fSlackFan >= 0 )
            Abc_SclFindCriticalNodeWindow_rec( p, pNext, vPath, fSlackFan, fDept );
    }
    if ( Abc_ObjFaninNum(pObj) > 0 )
        Vec_IntPush( vPath, Abc_ObjId(pObj) );
}